

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

date_t duckdb::TimeBucket::WidthConvertibleToMonthsBinaryOperator::
       Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t>
                 (interval_t bucket_width,date_t ts)

{
  bool bVar1;
  int32_t origin_months;
  date_t in_EDX;
  int32_t ts_months;
  int32_t in_stack_ffffffffffffffdc;
  date_t bucket_width_months;
  undefined4 local_4;
  
  bucket_width_months.days = in_EDX.days;
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(in_EDX);
  if (bVar1) {
    origin_months = EpochMonths<duckdb::date_t>(in_EDX);
    WidthConvertibleToMonthsCommon(bucket_width_months.days,in_stack_ffffffffffffffdc,origin_months)
    ;
    local_4 = Cast::Operation<duckdb::date_t,duckdb::date_t>(ts_months);
  }
  else {
    local_4 = Cast::Operation<duckdb::date_t,duckdb::date_t>(ts_months);
  }
  return (date_t)local_4;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(ts);
			return Cast::template Operation<date_t, TR>(
			    WidthConvertibleToMonthsCommon(bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS));
		}